

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

void tdefl_calculate_minimum_redundancy(tdefl_sym_freq *A,int n)

{
  bool bVar1;
  int dpth;
  int used;
  int avbl;
  int next;
  int leaf;
  int root;
  int n_local;
  tdefl_sym_freq *A_local;
  
  if (n != 0) {
    if (n == 1) {
      A->m_key = 1;
    }
    else {
      A->m_key = A->m_key + A[1].m_key;
      root = 0;
      leaf = 2;
      for (next = 1; next < n + -1; next = next + 1) {
        if ((leaf < n) && (A[leaf].m_key <= A[root].m_key)) {
          A[next].m_key = A[leaf].m_key;
          leaf = leaf + 1;
        }
        else {
          A[next].m_key = A[root].m_key;
          A[root].m_key = (mz_uint16)next;
          root = root + 1;
        }
        if ((leaf < n) && ((next <= root || (A[leaf].m_key <= A[root].m_key)))) {
          A[next].m_key = A[next].m_key + A[leaf].m_key;
          leaf = leaf + 1;
        }
        else {
          A[next].m_key = A[next].m_key + A[root].m_key;
          A[root].m_key = (mz_uint16)next;
          root = root + 1;
        }
      }
      A[n + -2].m_key = 0;
      for (next = n + -3; -1 < next; next = next + -1) {
        A[next].m_key = A[A[next].m_key].m_key + 1;
      }
      dpth = 0;
      root = n + -2;
      next = n + -1;
      avbl = 1;
      while (used = 0, 0 < avbl) {
        while( true ) {
          bVar1 = false;
          if (-1 < root) {
            bVar1 = (uint)A[root].m_key == dpth;
          }
          if (!bVar1) break;
          used = used + 1;
          root = root + -1;
        }
        for (; used < avbl; avbl = avbl + -1) {
          A[next].m_key = (mz_uint16)dpth;
          next = next + -1;
        }
        dpth = dpth + 1;
        avbl = used << 1;
      }
    }
  }
  return;
}

Assistant:

static void tdefl_calculate_minimum_redundancy(tdefl_sym_freq *A, int n) {
  int root, leaf, next, avbl, used, dpth;
  if (n == 0)
    return;
  else if (n == 1) {
    A[0].m_key = 1;
    return;
  }
  A[0].m_key += A[1].m_key;
  root = 0;
  leaf = 2;
  for (next = 1; next < n - 1; next++) {
    if (leaf >= n || A[root].m_key < A[leaf].m_key) {
      A[next].m_key = A[root].m_key;
      A[root++].m_key = (mz_uint16)next;
    } else
      A[next].m_key = A[leaf++].m_key;
    if (leaf >= n || (root < next && A[root].m_key < A[leaf].m_key)) {
      A[next].m_key = (mz_uint16)(A[next].m_key + A[root].m_key);
      A[root++].m_key = (mz_uint16)next;
    } else
      A[next].m_key = (mz_uint16)(A[next].m_key + A[leaf++].m_key);
  }
  A[n - 2].m_key = 0;
  for (next = n - 3; next >= 0; next--)
    A[next].m_key = A[A[next].m_key].m_key + 1;
  avbl = 1;
  used = dpth = 0;
  root = n - 2;
  next = n - 1;
  while (avbl > 0) {
    while (root >= 0 && (int)A[root].m_key == dpth) {
      used++;
      root--;
    }
    while (avbl > used) {
      A[next--].m_key = (mz_uint16)(dpth);
      avbl--;
    }
    avbl = 2 * used;
    dpth++;
    used = 0;
  }
}